

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_fdset(Curl_multi *multi,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  byte bVar1;
  int iVar2;
  Curl_easy *data;
  CURLMcode CVar3;
  int iVar4;
  ulong uVar5;
  Curl_easy **ppCVar6;
  easy_pollset ps;
  
  CVar3 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) {
    if ((multi->field_0x1b1 & 4) == 0) {
      ps.sockets[4] = 0;
      ps.num = 0;
      ps.actions[0] = '\0';
      ps.actions[1] = '\0';
      ps.actions[2] = '\0';
      ps.actions[3] = '\0';
      ps.actions[4] = '\0';
      ps._29_3_ = 0;
      ps.sockets[0] = 0;
      ps.sockets[1] = 0;
      ps.sockets[2] = 0;
      ps.sockets[3] = 0;
      iVar4 = -1;
      ppCVar6 = &multi->easyp;
      while (data = *ppCVar6, data != (Curl_easy *)0x0) {
        multi_getsock(data,&ps);
        for (uVar5 = 0; (ulong)ps._16_8_ >> 0x20 != uVar5; uVar5 = uVar5 + 1) {
          iVar2 = ps.sockets[uVar5];
          if (iVar2 < 0x400) {
            bVar1 = ps.actions[uVar5];
            if ((bVar1 & 1) != 0) {
              read_fd_set->fds_bits[iVar2 / 0x40] =
                   read_fd_set->fds_bits[iVar2 / 0x40] | 1L << ((byte)iVar2 & 0x3f);
            }
            if ((bVar1 & 2) != 0) {
              write_fd_set->fds_bits[iVar2 / 0x40] =
                   write_fd_set->fds_bits[iVar2 / 0x40] | 1L << ((byte)iVar2 & 0x3f);
            }
            if (iVar4 < iVar2) {
              iVar4 = iVar2;
            }
          }
        }
        ppCVar6 = &data->next;
      }
      *max_fd = iVar4;
      CVar3 = CURLM_OK;
    }
    else {
      CVar3 = CURLM_RECURSIVE_API_CALL;
    }
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_fdset(struct Curl_multi *multi,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  struct Curl_easy *data;
  int this_max_fd = -1;
  struct easy_pollset ps;
  unsigned int i;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  memset(&ps, 0, sizeof(ps));
  for(data = multi->easyp; data; data = data->next) {
    multi_getsock(data, &ps);

    for(i = 0; i < ps.num; i++) {
      if(!FDSET_SOCK(ps.sockets[i]))
        /* pretend it doesn't exist */
        continue;
      if(ps.actions[i] & CURL_POLL_IN)
        FD_SET(ps.sockets[i], read_fd_set);
      if(ps.actions[i] & CURL_POLL_OUT)
        FD_SET(ps.sockets[i], write_fd_set);
      if((int)ps.sockets[i] > this_max_fd)
        this_max_fd = (int)ps.sockets[i];
    }
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}